

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

HeapLeafObject * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::findObject
          (Interpreter *this,Identifier *f,HeapObject *curr,uint start_from,uint *counter)

{
  bool bVar1;
  HeapLeafObject *pHVar2;
  uint in_ECX;
  Identifier *in_RDX;
  Interpreter *in_RSI;
  uint *in_R8;
  iterator it_1;
  HeapComprehensionObject *comp;
  const_iterator it;
  HeapSimpleObject *simp;
  HeapLeafObject *l;
  HeapLeafObject *r;
  HeapExtendedObject *ext;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_ffffffffffffff48;
  HeapLeafObject *local_b0;
  HeapLeafObject *local_a0;
  uint *local_90;
  _Self local_78;
  _Self local_70;
  HeapLeafObject *local_68;
  _Self local_60;
  _Self local_58;
  HeapLeafObject *local_50;
  HeapLeafObject *local_40;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_RDX == (Identifier *)0x0) {
    local_90 = (uint *)0x0;
  }
  else {
    local_90 = (uint *)__dynamic_cast(in_RDX,&(anonymous_namespace)::HeapObject::typeinfo,
                                      &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
  }
  if (local_90 == (uint *)0x0) {
    if (in_ECX <= *in_R8) {
      if (in_RDX == (Identifier *)0x0) {
        local_a0 = (HeapLeafObject *)0x0;
      }
      else {
        local_a0 = (HeapLeafObject *)
                   __dynamic_cast(in_RDX,&(anonymous_namespace)::HeapObject::typeinfo,
                                  &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
      }
      local_50 = local_a0;
      if (local_a0 == (HeapLeafObject *)0x0) {
        if (in_RDX == (Identifier *)0x0) {
          local_b0 = (HeapLeafObject *)0x0;
        }
        else {
          local_b0 = (HeapLeafObject *)
                     __dynamic_cast(in_RDX,&(anonymous_namespace)::HeapObject::typeinfo,
                                    &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
        }
        local_68 = local_b0;
        if (local_b0 != (HeapLeafObject *)0x0) {
          local_70._M_node =
               (_Base_ptr)
               std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               ::find(in_stack_ffffffffffffff48,(key_type *)0x24279c);
          local_78._M_node =
               (_Base_ptr)
               std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               ::end(in_stack_ffffffffffffff48);
          bVar1 = std::operator!=(&local_70,&local_78);
          if (bVar1) {
            return local_68;
          }
        }
      }
      else {
        local_58._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
             ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                     *)in_stack_ffffffffffffff48,(key_type *)0x2426f1);
        local_60._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
             ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                    *)in_stack_ffffffffffffff48);
        bVar1 = std::operator!=(&local_58,&local_60);
        if (bVar1) {
          return local_50;
        }
      }
    }
    *in_R8 = *in_R8 + 1;
  }
  else {
    local_40 = findObject(in_RSI,in_RDX,(HeapObject *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                          (uint)((ulong)in_R8 >> 0x20),local_90);
    if (local_40 != (HeapLeafObject *)0x0) {
      return local_40;
    }
    pHVar2 = findObject(in_RSI,in_RDX,(HeapObject *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                        (uint)((ulong)in_R8 >> 0x20),local_90);
    if (pHVar2 != (HeapLeafObject *)0x0) {
      return pHVar2;
    }
  }
  return (HeapLeafObject *)0x0;
}

Assistant:

HeapLeafObject *findObject(const Identifier *f, HeapObject *curr, unsigned start_from,
                               unsigned &counter)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            auto *r = findObject(f, ext->right, start_from, counter);
            if (r)
                return r;
            auto *l = findObject(f, ext->left, start_from, counter);
            if (l)
                return l;
        } else {
            if (counter >= start_from) {
                if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                    auto it = simp->fields.find(f);
                    if (it != simp->fields.end()) {
                        return simp;
                    }
                } else if (auto *comp = dynamic_cast<HeapComprehensionObject *>(curr)) {
                    auto it = comp->compValues.find(f);
                    if (it != comp->compValues.end()) {
                        return comp;
                    }
                }
            }
            counter++;
        }
        return nullptr;
    }